

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

int __thiscall ImFontAtlas::CustomRectRegister(ImFontAtlas *this,uint id,int width,int height)

{
  int iVar1;
  CustomRect *pCVar2;
  CustomRect *__dest;
  int iVar3;
  int iVar4;
  
  if (0xfffe < width - 1U) {
    __assert_fail("width > 0 && width <= 0xFFFF",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui_draw.cpp"
                  ,0x529,"int ImFontAtlas::CustomRectRegister(unsigned int, int, int)");
  }
  if (height - 1U < 0xffff) {
    iVar4 = (this->CustomRects).Size;
    iVar1 = (this->CustomRects).Capacity;
    if (iVar4 == iVar1) {
      iVar4 = iVar4 + 1;
      if (iVar1 == 0) {
        iVar3 = 8;
      }
      else {
        iVar3 = iVar1 / 2 + iVar1;
      }
      if (iVar4 < iVar3) {
        iVar4 = iVar3;
      }
      if (iVar1 < iVar4) {
        __dest = (CustomRect *)ImGui::MemAlloc((long)iVar4 * 0xc);
        pCVar2 = (this->CustomRects).Data;
        if (pCVar2 != (CustomRect *)0x0) {
          memcpy(__dest,pCVar2,(long)(this->CustomRects).Size * 0xc);
        }
        ImGui::MemFree((this->CustomRects).Data);
        (this->CustomRects).Data = __dest;
        (this->CustomRects).Capacity = iVar4;
      }
    }
    pCVar2 = (this->CustomRects).Data;
    iVar4 = (this->CustomRects).Size;
    (this->CustomRects).Size = iVar4 + 1;
    pCVar2[iVar4].ID = id;
    pCVar2[iVar4].Width = (unsigned_short)width;
    pCVar2[iVar4].Height = (unsigned_short)height;
    pCVar2[iVar4].X = 0xffff;
    pCVar2[iVar4].Y = 0xffff;
    return (this->CustomRects).Size + -1;
  }
  __assert_fail("height > 0 && height <= 0xFFFF",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui_draw.cpp"
                ,0x52a,"int ImFontAtlas::CustomRectRegister(unsigned int, int, int)");
}

Assistant:

int ImFontAtlas::CustomRectRegister(unsigned int id, int width, int height)
{
    IM_ASSERT(width > 0 && width <= 0xFFFF);
    IM_ASSERT(height > 0 && height <= 0xFFFF);
    CustomRect r;
    r.ID = id;
    r.Width = (unsigned short)width;
    r.Height = (unsigned short)height;
    CustomRects.push_back(r);
    return CustomRects.Size - 1; // Return index
}